

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineCam.cpp
# Opt level: O2

void __thiscall chrono::geometry::ChLineCam::ChLineCam(ChLineCam *this,ChLineCam *source)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  ChLine::ChLine(&this->super_ChLine,&source->super_ChLine);
  (this->super_ChLine).super_ChGeometry._vptr_ChGeometry = (_func_int **)&PTR__ChLineCam_0118a180;
  (this->law).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->law).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->center).m_data[0] = 0.0;
  (this->center).m_data[1] = 0.0;
  (this->center).m_data[2] = 0.0;
  this->type = source->type;
  dVar1 = source->Rr;
  dVar2 = source->p;
  dVar3 = source->d;
  this->Rb = source->Rb;
  this->Rr = dVar1;
  this->p = dVar2;
  this->d = dVar3;
  this->b0 = source->b0;
  if (source != this) {
    (this->center).m_data[0] = (source->center).m_data[0];
    (this->center).m_data[1] = (source->center).m_data[1];
    (this->center).m_data[2] = (source->center).m_data[2];
  }
  dVar1 = source->s;
  this->e = source->e;
  this->s = dVar1;
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->law).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>,
             &(source->law).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>);
  this->negative = source->negative;
  this->internal = source->internal;
  return;
}

Assistant:

ChLineCam::ChLineCam(const ChLineCam& source) : ChLine(source) {
    type = source.type;
    Rb = source.Rb;
    Rr = source.Rr;
    p = source.p;
    d = source.d;
    b0 = source.b0;
    center = source.center;
    e = source.e;
    s = source.s;
    law = source.law;
    negative = source.negative;
    internal = source.internal;
}